

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3_uri_parameter(char *zFilename,char *zParam)

{
  int iVar1;
  int iVar2;
  char *z;
  int x;
  char *zParam_local;
  char *zFilename_local;
  
  if ((zFilename != (char *)0x0) && (zParam != (char *)0x0)) {
    iVar1 = sqlite3Strlen30(zFilename);
    zParam_local = zFilename + (iVar1 + 1);
    while (*zParam_local != '\0') {
      iVar1 = strcmp(zParam_local,zParam);
      iVar2 = sqlite3Strlen30(zParam_local);
      z = zParam_local + (iVar2 + 1);
      if (iVar1 == 0) {
        return z;
      }
      iVar1 = sqlite3Strlen30(z);
      zParam_local = z + (iVar1 + 1);
    }
  }
  return (char *)0x0;
}

Assistant:

SQLITE_API const char *sqlite3_uri_parameter(const char *zFilename, const char *zParam){
  if( zFilename==0 || zParam==0 ) return 0;
  zFilename += sqlite3Strlen30(zFilename) + 1;
  while( zFilename[0] ){
    int x = strcmp(zFilename, zParam);
    zFilename += sqlite3Strlen30(zFilename) + 1;
    if( x==0 ) return zFilename;
    zFilename += sqlite3Strlen30(zFilename) + 1;
  }
  return 0;
}